

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQInteger __thiscall SQSharedState::GetMetaMethodIdxByName(SQSharedState *this,SQObjectPtr *name)

{
  bool bVar1;
  undefined1 local_30 [8];
  SQObjectPtr ret;
  SQObjectPtr *name_local;
  SQSharedState *this_local;
  
  if ((name->super_SQObject)._type == OT_STRING) {
    ret.super_SQObject._unVal = (SQObjectValue)name;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_30);
    bVar1 = SQTable::Get((this->_metamethodsmap).super_SQObject._unVal.pTable,
                         (SQObjectPtr *)ret.super_SQObject._unVal.pTable,(SQObjectPtr *)local_30);
    if (bVar1) {
      this_local = (SQSharedState *)ret.super_SQObject._0_8_;
    }
    else {
      this_local = (SQSharedState *)0xffffffffffffffff;
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_30);
  }
  else {
    this_local = (SQSharedState *)0xffffffffffffffff;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQSharedState::GetMetaMethodIdxByName(const SQObjectPtr &name)
{
    if(sq_type(name) != OT_STRING)
        return -1;
    SQObjectPtr ret;
    if(_table(_metamethodsmap)->Get(name,ret)) {
        return _integer(ret);
    }
    return -1;
}